

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void tinyexr::DecodePixelData
               (uchar **out_images,int *requested_pixel_types,uchar *data_ptr,size_t data_len,
               int compression_type,int line_order,int width,int height,int x_stride,int y,
               int line_no,int num_lines,size_t pixel_data_size,size_t num_attributes,
               EXRAttribute *attributes,size_t num_channels,EXRChannelInfo *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list)

{
  ushort uVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  uchar uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  pointer __dest;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uchar *puVar24;
  long lVar25;
  float fVar26;
  long lVar27;
  ulong uVar28;
  size_t sVar29;
  uchar *puVar30;
  int iVar31;
  size_type sVar32;
  ulong uVar33;
  unsigned_long dstLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  allocator_type local_61;
  int *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  uchar *local_40;
  long local_38;
  
  local_60 = requested_pixel_types;
  if (compression_type == 4) {
    sVar32 = (long)(num_lines * width) * pixel_data_size;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_80,sVar32,(allocator_type *)&local_58);
    if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      DecompressPiz(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,data_ptr,sVar32,(int)num_attributes,
                    (EXRChannelInfo *)attributes,width,num_lines);
      puVar30 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (0 < (long)num_attributes) {
        lVar13 = (long)x_stride;
        local_38 = *(long *)num_channels;
        local_40 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)width;
        uVar8 = 1;
        if (1 < (int)num_attributes) {
          uVar8 = num_attributes & 0xffffffff;
        }
        uVar33 = (ulong)(uint)width;
        uVar14 = 0;
        do {
          iVar31 = *(int *)(attributes->type + uVar14 * 0x110);
          if (iVar31 == 0) {
            if (0 < num_lines) {
              lVar11 = *(long *)(local_38 + uVar14 * 8);
              puVar24 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar11;
              uVar28 = 0;
              do {
                if (uVar16 <= (uVar28 * pixel_data_size + lVar11) * lVar20) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_0012ed63;
                }
                if (0 < width) {
                  uVar21 = line_no + (int)uVar28;
                  uVar19 = ~uVar21 + height;
                  if (line_order == 0) {
                    uVar19 = uVar21;
                  }
                  puVar3 = out_images[uVar14];
                  uVar18 = 0;
                  do {
                    *(undefined4 *)(puVar3 + uVar18 * 4 + (long)(int)(uVar19 * x_stride) * 4) =
                         *(undefined4 *)(puVar24 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar33 != uVar18);
                }
                uVar28 = uVar28 + 1;
                puVar24 = puVar24 + pixel_data_size * lVar20;
              } while (uVar28 != (uint)num_lines);
            }
          }
          else if (iVar31 == 1) {
            if (0 < num_lines) {
              lVar11 = *(long *)(local_38 + uVar14 * 8);
              puVar24 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar11;
              uVar28 = 0;
              do {
                if (uVar16 <= (uVar28 * pixel_data_size + lVar11) * lVar20) goto LAB_0012ed63;
                if (0 < width) {
                  uVar7 = (int)uVar28 + line_no;
                  uVar22 = (int)uVar28 + line_no;
                  uVar19 = ~uVar22 + height;
                  uVar21 = ~uVar7 + height;
                  if (line_order == 0) {
                    uVar19 = uVar22;
                    uVar21 = uVar7;
                  }
                  iVar31 = local_60[uVar14];
                  uVar18 = 0;
                  do {
                    uVar1 = *(ushort *)(puVar24 + uVar18 * 2);
                    if (iVar31 == 1) {
                      *(ushort *)
                       (out_images[uVar14] + uVar18 * 2 + (long)(int)(uVar19 * x_stride) * 2) =
                           uVar1;
                    }
                    else {
                      uVar7 = (uint)uVar1 << 0xd;
                      if ((uVar7 & 0xf800000) == 0xf800000) {
                        fVar26 = (float)(uVar7 | 0x70000000);
                      }
                      else if ((uVar7 & 0xf800000) == 0) {
                        fVar26 = (float)(uVar7 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar26 = (float)((uVar7 & 0xfffe000) + 0x38000000);
                      }
                      *(uint *)(out_images[uVar14] + uVar18 * 4 + (long)(int)(uVar21 * x_stride) * 4
                               ) = (int)(short)uVar1 & 0x80000000U | (uint)fVar26;
                    }
                    uVar18 = uVar18 + 1;
                  } while (uVar33 != uVar18);
                }
                uVar28 = uVar28 + 1;
                puVar24 = puVar24 + pixel_data_size * lVar20;
              } while (uVar28 != (uint)num_lines);
            }
          }
          else if ((iVar31 == 2) && (0 < num_lines)) {
            lVar11 = *(long *)(local_38 + uVar14 * 8);
            puVar24 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar13 * lVar11;
            uVar28 = 0;
            do {
              if (uVar16 <= (uVar28 * pixel_data_size + lVar11) * lVar13) goto LAB_0012ed74;
              if (0 < width) {
                uVar21 = line_no + (int)uVar28;
                uVar19 = ~uVar21 + height;
                if (line_order == 0) {
                  uVar19 = uVar21;
                }
                puVar3 = out_images[uVar14];
                uVar18 = 0;
                do {
                  *(undefined4 *)(puVar3 + uVar18 * 4 + (long)(int)(uVar19 * x_stride) * 4) =
                       *(undefined4 *)(puVar24 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar33 != uVar18);
              }
              uVar28 = uVar28 + 1;
              puVar24 = puVar24 + pixel_data_size * lVar13;
            } while (uVar28 != (uint)num_lines);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar8);
      }
joined_r0x0012e6a2:
      if (puVar30 != (uchar *)0x0) {
        operator_delete(puVar30,(long)puVar5 - (long)puVar30);
      }
      return;
    }
    goto LAB_0012ede8;
  }
  if ((compression_type & 0xfffffffeU) == 2) {
    lVar20 = (long)width;
    lVar13 = (long)num_lines;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_80,lVar13 * lVar20 * pixel_data_size,(allocator_type *)&local_58);
    local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      DecompressZip(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)&local_58,data_ptr,
                    data_len);
      puVar30 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (num_attributes != 0) {
        lVar11 = *(long *)num_channels;
        uVar8 = (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)height;
        lVar10 = (long)line_no;
        lVar27 = (long)x_stride;
        lVar17 = pixel_data_size * lVar20;
        sVar29 = 0;
        do {
          iVar31 = *(int *)(attributes->type + sVar29 * 0x110);
          if (iVar31 == 0) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar11 + sVar29 * 8);
              puVar24 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar4;
              lVar23 = 0;
              do {
                if (uVar8 <= (lVar23 * pixel_data_size + lVar4) * lVar20) goto LAB_0012ed82;
                if (width != 0) {
                  uVar16 = lVar10 + lVar23;
                  if (line_order != 0) {
                    uVar16 = ~(lVar10 + lVar23) + lVar9;
                  }
                  puVar3 = out_images[sVar29];
                  lVar25 = 0;
                  do {
                    *(undefined4 *)(puVar3 + lVar25 * 4 + uVar16 * lVar27 * 4) =
                         *(undefined4 *)(puVar24 + lVar25 * 4);
                    lVar25 = lVar25 + 1;
                  } while (lVar20 != lVar25);
                }
                lVar23 = lVar23 + 1;
                puVar24 = puVar24 + lVar17;
              } while (lVar23 != lVar13);
            }
          }
          else if (iVar31 == 1) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar11 + sVar29 * 8);
              puVar24 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar4;
              lVar23 = 0;
              do {
                if (uVar8 <= (lVar23 * pixel_data_size + lVar4) * lVar20) goto LAB_0012ed93;
                if (width != 0) {
                  uVar16 = lVar23 + lVar10;
                  if (line_order != 0) {
                    uVar16 = ~(lVar23 + lVar10) + lVar9;
                  }
                  iVar31 = local_60[sVar29];
                  lVar25 = 0;
                  do {
                    uVar1 = *(ushort *)(puVar24 + lVar25 * 2);
                    if (iVar31 == 1) {
                      *(ushort *)(out_images[sVar29] + lVar25 * 2 + uVar16 * lVar27 * 2) = uVar1;
                    }
                    else {
                      uVar19 = (uint)uVar1 << 0xd;
                      if ((uVar19 & 0xf800000) == 0xf800000) {
                        fVar26 = (float)(uVar19 | 0x70000000);
                      }
                      else if ((uVar19 & 0xf800000) == 0) {
                        fVar26 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar26 = (float)((uVar19 & 0xfffe000) + 0x38000000);
                      }
                      *(uint *)(out_images[sVar29] + lVar25 * 4 + uVar16 * lVar27 * 4) =
                           (int)(short)uVar1 & 0x80000000U | (uint)fVar26;
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar20 != lVar25);
                }
                lVar23 = lVar23 + 1;
                puVar24 = puVar24 + lVar17;
              } while (lVar23 != lVar13);
            }
          }
          else if ((iVar31 == 2) && (num_lines != 0)) {
            lVar4 = *(long *)(lVar11 + sVar29 * 8);
            puVar24 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar4;
            lVar23 = 0;
            do {
              if (uVar8 <= (lVar23 * pixel_data_size + lVar4) * lVar20) goto LAB_0012eda4;
              if (width != 0) {
                uVar16 = lVar10 + lVar23;
                if (line_order != 0) {
                  uVar16 = ~(lVar10 + lVar23) + lVar9;
                }
                puVar3 = out_images[sVar29];
                lVar25 = 0;
                do {
                  *(undefined4 *)(puVar3 + lVar25 * 4 + uVar16 * lVar27 * 4) =
                       *(undefined4 *)(puVar24 + lVar25 * 4);
                  lVar25 = lVar25 + 1;
                } while (lVar20 != lVar25);
              }
              lVar23 = lVar23 + 1;
              puVar24 = puVar24 + lVar17;
            } while (lVar23 != lVar13);
          }
          sVar29 = sVar29 + 1;
        } while (sVar29 != num_attributes);
      }
      goto joined_r0x0012e6a2;
    }
    goto LAB_0012edfa;
  }
  if (compression_type != 1) {
    if (compression_type != 0) {
      return;
    }
    if (num_attributes == 0) {
      return;
    }
    iVar31 = ~y + height;
    if (line_order == 0) {
      iVar31 = y;
    }
    uVar8 = (ulong)(uint)width;
    sVar29 = 0;
    lVar13 = (long)(iVar31 * x_stride) * 4;
    puVar30 = data_ptr;
    do {
      iVar2 = *(int *)(attributes->type + sVar29 * 0x110);
      if (iVar2 == 0) {
        if (0 < width) {
          puVar24 = out_images[sVar29];
          uVar16 = 0;
          do {
            *(undefined4 *)(puVar24 + uVar16 * 4 + lVar13) = *(undefined4 *)(data_ptr + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar8 != uVar16);
        }
      }
      else if (iVar2 == 2) {
        if (0 < width) {
          puVar24 = out_images[sVar29];
          uVar16 = 0;
          do {
            *(undefined4 *)(puVar24 + uVar16 * 4 + lVar13) = *(undefined4 *)(data_ptr + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar8 != uVar16);
        }
      }
      else if (iVar2 == 1) {
        if (requested_pixel_types[sVar29] == 2) {
          if (0 < width) {
            puVar24 = out_images[sVar29];
            uVar16 = 0;
            do {
              uVar19 = (uint)*(ushort *)(puVar30 + uVar16 * 2) << 0xd;
              if ((uVar19 & 0xf800000) == 0xf800000) {
                fVar26 = (float)(uVar19 | 0x70000000);
              }
              else if ((uVar19 & 0xf800000) == 0) {
                fVar26 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
              }
              else {
                fVar26 = (float)((uVar19 & 0xfffe000) + 0x38000000);
              }
              *(uint *)(puVar24 + uVar16 * 4 + lVar13) =
                   (int)(short)*(ushort *)(puVar30 + uVar16 * 2) & 0x80000000U | (uint)fVar26;
              uVar16 = uVar16 + 1;
            } while (uVar8 != uVar16);
          }
        }
        else if ((requested_pixel_types[sVar29] == 1) && (0 < width)) {
          puVar24 = out_images[sVar29];
          uVar16 = 0;
          do {
            *(undefined2 *)(puVar24 + uVar16 * 2 + (long)(iVar31 * x_stride) * 2) =
                 *(undefined2 *)(puVar30 + uVar16 * 2);
            uVar16 = uVar16 + 1;
          } while (uVar8 != uVar16);
        }
      }
      sVar29 = sVar29 + 1;
      data_ptr = data_ptr + (long)width * 4;
      puVar30 = puVar30 + (long)width * 2;
    } while (sVar29 != num_attributes);
    return;
  }
  lVar20 = (long)width;
  lVar13 = (long)num_lines;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,lVar13 * lVar20 * pixel_data_size,(allocator_type *)&local_80);
  puVar6 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar32 = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (sVar32 == 0) goto LAB_0012ee0a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_80,sVar32,&local_61);
  if (0 < (long)data_len) {
    uVar8 = sVar32 & 0xffffffff;
    __dest = puVar5;
    do {
      iVar31 = (int)(char)*data_ptr;
      if ((char)*data_ptr < '\0') {
        uVar19 = (int)uVar8 + iVar31;
        if ((int)uVar19 < 0) break;
        uVar8 = (ulong)(uint)-iVar31;
        memcpy(__dest,data_ptr + 1,uVar8);
        data_ptr = data_ptr + 1 + uVar8;
        uVar21 = ((int)data_len + iVar31) - 1;
      }
      else {
        uVar19 = (int)uVar8 - (iVar31 + 1U);
        if ((int)uVar19 < 0) break;
        uVar8 = (ulong)(iVar31 + 1U);
        memset(__dest,(uint)data_ptr[1],uVar8);
        data_ptr = data_ptr + 2;
        uVar21 = (int)data_len - 2;
      }
      __dest = __dest + uVar8;
      data_len = (size_t)uVar21;
      uVar8 = (ulong)uVar19;
    } while (0 < (int)uVar21);
  }
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (1 < (long)sVar32) {
      uVar15 = *local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar30 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      do {
        uVar15 = uVar15 + *puVar30 + 0x80;
        *puVar30 = uVar15;
        puVar30 = puVar30 + 1;
      } while (puVar30 < local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + sVar32);
    }
    if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (0 < (long)sVar32) {
        lVar11 = 0;
        do {
          puVar30 = puVar5 + lVar11 * 2;
          *puVar30 = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar11];
          if (puVar6 <= puVar30 + 1) break;
          puVar30[1] = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar11 + (sVar32 + 1 >> 1)];
          lVar11 = lVar11 + 1;
        } while (puVar30 + 2 < puVar6);
      }
      if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      puVar30 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar5 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (num_attributes != 0) {
        lVar11 = *(long *)num_channels;
        uVar8 = (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)height;
        lVar10 = (long)line_no;
        lVar27 = (long)x_stride;
        lVar17 = pixel_data_size * lVar20;
        sVar29 = 0;
        do {
          iVar31 = *(int *)(attributes->type + sVar29 * 0x110);
          if (iVar31 == 0) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar11 + sVar29 * 8);
              puVar24 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar4;
              lVar23 = 0;
              do {
                if (uVar8 <= (lVar23 * pixel_data_size + lVar4) * lVar20) goto LAB_0012edb5;
                if (width != 0) {
                  uVar16 = lVar10 + lVar23;
                  if (line_order != 0) {
                    uVar16 = ~(lVar10 + lVar23) + lVar9;
                  }
                  puVar3 = out_images[sVar29];
                  lVar25 = 0;
                  do {
                    *(undefined4 *)(puVar3 + lVar25 * 4 + uVar16 * lVar27 * 4) =
                         *(undefined4 *)(puVar24 + lVar25 * 4);
                    lVar25 = lVar25 + 1;
                  } while (lVar20 != lVar25);
                }
                lVar23 = lVar23 + 1;
                puVar24 = puVar24 + lVar17;
              } while (lVar23 != lVar13);
            }
          }
          else if (iVar31 == 1) {
            if (num_lines != 0) {
              lVar4 = *(long *)(lVar11 + sVar29 * 8);
              puVar24 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar4;
              lVar23 = 0;
              do {
                if (uVar8 <= (lVar23 * pixel_data_size + lVar4) * lVar20) goto LAB_0012edc6;
                if (width != 0) {
                  uVar16 = lVar10 + lVar23;
                  if (line_order != 0) {
                    uVar16 = ~(lVar10 + lVar23) + lVar9;
                  }
                  iVar31 = local_60[sVar29];
                  lVar25 = 0;
                  do {
                    uVar1 = *(ushort *)(puVar24 + lVar25 * 2);
                    if (iVar31 == 1) {
                      *(ushort *)(out_images[sVar29] + lVar25 * 2 + uVar16 * lVar27 * 2) = uVar1;
                    }
                    else {
                      uVar19 = (uint)uVar1 << 0xd;
                      if ((uVar19 & 0xf800000) == 0xf800000) {
                        fVar26 = (float)(uVar19 | 0x70000000);
                      }
                      else if ((uVar19 & 0xf800000) == 0) {
                        fVar26 = (float)(uVar19 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar26 = (float)((uVar19 & 0xfffe000) + 0x38000000);
                      }
                      *(uint *)(out_images[sVar29] + lVar25 * 4 + uVar16 * lVar27 * 4) =
                           (int)(short)uVar1 & 0x80000000U | (uint)fVar26;
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar20 != lVar25);
                }
                lVar23 = lVar23 + 1;
                puVar24 = puVar24 + lVar17;
              } while (lVar23 != lVar13);
            }
          }
          else if ((iVar31 == 2) && (num_lines != 0)) {
            lVar4 = *(long *)(lVar11 + sVar29 * 8);
            puVar24 = local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar20 * lVar4;
            lVar23 = 0;
            do {
              if (uVar8 <= (lVar23 * pixel_data_size + lVar4) * lVar20) goto LAB_0012edd7;
              if (width != 0) {
                uVar16 = lVar10 + lVar23;
                if (line_order != 0) {
                  uVar16 = ~(lVar10 + lVar23) + lVar9;
                }
                puVar3 = out_images[sVar29];
                lVar25 = 0;
                do {
                  *(undefined4 *)(puVar3 + lVar25 * 4 + uVar16 * lVar27 * 4) =
                       *(undefined4 *)(puVar24 + lVar25 * 4);
                  lVar25 = lVar25 + 1;
                } while (lVar20 != lVar25);
              }
              lVar23 = lVar23 + 1;
              puVar24 = puVar24 + lVar17;
            } while (lVar23 != lVar13);
          }
          sVar29 = sVar29 + 1;
        } while (sVar29 != num_attributes);
      }
      goto joined_r0x0012e6a2;
    }
    goto LAB_0012ee2f;
  }
  goto LAB_0012ee1d;
LAB_0012ed63:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012ed74:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012ed82:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012ed93:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012eda4:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012edb5:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012edc6:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012edd7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0012ede8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0012edfa:
  sVar32 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0)
  ;
LAB_0012ee0a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,sVar32);
LAB_0012ee1d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0012ee2f:
  uVar12 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

static void DecodePixelData(/* out */ unsigned char **out_images,
                            const int *requested_pixel_types,
                            const unsigned char *data_ptr, size_t data_len,
                            int compression_type, int line_order, int width,
                            int height, int x_stride, int y, int line_no,
                            int num_lines, size_t pixel_data_size,
                            size_t num_attributes,
                            const EXRAttribute *attributes, size_t num_channels,
                            const EXRChannelInfo *channels,
                            const std::vector<size_t> &channel_offset_list) {
  if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {  // PIZ
#if TINYEXR_USE_PIZ
    // Allocate original data size.
    std::vector<unsigned char> outBuf(
        static_cast<size_t>(width * num_lines * pixel_data_size));
    size_t tmpBufLen = static_cast<size_t>(width * num_lines * pixel_data_size);

    bool ret = tinyexr::DecompressPiz(
        reinterpret_cast<unsigned char *>(&outBuf.at(0)), data_ptr, tmpBufLen,
        num_channels, channels, width, num_lines);

    assert(ret);

    // For PIZ_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (int c = 0; c < static_cast<int>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int v = 0; v < num_lines; v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (int v = 0; v < num_lines; v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (int v = 0; v < num_lines; v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * x_stride +
                         channel_offset_list[c] * x_stride));
          for (int u = 0; u < width; u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    assert(0 && "PIZ is enabled in this build");
#endif

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS ||
             compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZip(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           &dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressRle(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param, attributes,
                                 num_attributes)) {
      assert(0);
      return;
    }

    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZfp(reinterpret_cast<float *>(&outBuf.at(0)), width,
                           num_lines, num_channels, data_ptr,
                           static_cast<unsigned long>(data_len),
                           zfp_compression_param);

    // For ZFP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      assert(channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT);
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    (void)attributes;
    (void)num_attributes;
    (void)num_channels;
    assert(0);
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    for (size_t c = 0; c < num_channels; c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        const unsigned short *line_ptr =
            reinterpret_cast<const unsigned short *>(
                data_ptr +
                c * static_cast<size_t>(width) * sizeof(unsigned short));

        if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          unsigned short *outLine =
              reinterpret_cast<unsigned short *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            outLine[u] = hf.u;
          }
        } else if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          float *outLine = reinterpret_cast<float *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            tinyexr::FP32 f32 = half_to_float(hf);

            outLine[u] = f32.f;
          }
        } else {
          assert(0);
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        const float *line_ptr = reinterpret_cast<const float *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(float));

        float *outLine = reinterpret_cast<float *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          float val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        const unsigned int *line_ptr = reinterpret_cast<const unsigned int *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(unsigned int));

        unsigned int *outLine = reinterpret_cast<unsigned int *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          unsigned int val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      }
    }
  }
}